

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O3

int_fast32_t transtime(int year,rule *rulep,int_fast32_t offset)

{
  rule_t rVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  char cVar10;
  int iVar11;
  
  iVar4 = _PDCLIB_is_leap(year);
  rVar1 = rulep->type;
  if (rVar1 == MONTH_NTH_DAY_OF_WEEK) {
    iVar2 = rulep->mon;
    iVar5 = iVar2 + 9;
    iVar11 = year - (uint)(iVar2 < 3);
    iVar6 = (int)((ulong)((long)iVar11 * -0x51eb851f) >> 0x20);
    cVar10 = (char)(iVar11 % 100);
    iVar5 = iVar11 / 400 + iVar11 % 100 + ((iVar6 >> 5) - (iVar6 >> 0x1f)) * 2 +
            (int)((char)(((byte)(cVar10 >> 7) >> 6) + cVar10) >> 2) +
            (int)(short)((short)(((short)iVar2 +
                                  ((short)((uint)(iVar5 / 6 + (iVar5 >> 0x1f)) >> 1) -
                                  (short)(iVar5 >> 0x1f)) * -0xc + 9) * 0x1a + 0x18) / 10 + 1);
    iVar6 = iVar5 % 7;
    iVar5 = iVar5 % 7 + 7;
    if (-1 < iVar6) {
      iVar5 = iVar6;
    }
    iVar5 = rulep->day - iVar5;
    iVar6 = rulep->week;
    iVar11 = iVar5 + 7;
    if (-1 < iVar5) {
      iVar11 = iVar5;
    }
    if (iVar6 < 2) {
      uVar7 = (ulong)(iVar2 - 1);
      iVar5 = iVar11;
    }
    else {
      uVar7 = (ulong)(iVar2 - 1U);
      iVar9 = iVar6 + -1;
      iVar3 = iVar11;
      do {
        iVar5 = iVar3;
        if (*(int *)((long)mon_lengths[0] +
                    (long)(int)(iVar2 - 1U) * 4 + (ulong)((uint)(iVar4 != 0) * 0x30)) <= iVar3 + 7)
        break;
        iVar9 = iVar9 + -1;
        iVar5 = iVar6 * 7 + iVar11 + -7;
        iVar3 = iVar3 + 7;
      } while (iVar9 != 0);
    }
    iVar5 = iVar5 * 0x15180;
    if (1 < iVar2) {
      uVar8 = 0;
      do {
        iVar5 = iVar5 + mon_lengths[iVar4 != 0][uVar8] * 0x15180;
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
  }
  else if (rVar1 == DAY_OF_YEAR) {
    iVar5 = rulep->day * 0x15180;
  }
  else {
    iVar5 = 0;
    if (rVar1 == JULIAN_DAY) {
      iVar5 = rulep->day * 0x15180;
      iVar2 = iVar5 + -0x15180;
      if (rulep->day < 0x3c) {
        iVar5 = iVar2;
      }
      if (iVar4 == 0) {
        iVar5 = iVar2;
      }
    }
  }
  return iVar5 + offset + rulep->time;
}

Assistant:

static int_fast32_t transtime( const int year, struct rule const * rulep, const int_fast32_t offset )
{
    bool         leapyear;
    int_fast32_t value = 0;
    int          i;
    int          d;
    int          m1;
    int          yy0;
    int          yy1;
    int          yy2;
    int          dow;

    leapyear = _PDCLIB_is_leap( year );

    switch ( rulep->type )
    {
        case JULIAN_DAY:
            /* Jn - Julian day, 1 == January 1, 60 == March 1 even in leap
               years.
               In non-leap years, or if the day number is 59 or less, just
               add SECSPERDAY times the day number-1 to the time of
               January 1, midnight, to get the day.
            */
            value = ( rulep->day - 1 ) * SECSPERDAY;

            if ( leapyear && rulep->day >= 60 )
            {
                value += SECSPERDAY;
            }

            break;

        case DAY_OF_YEAR:
            /* n - day of year.
               Just add SECSPERDAY times the day number to the time of
               January 1, midnight, to get the day.
            */
            value = rulep->day * SECSPERDAY;
            break;

        case MONTH_NTH_DAY_OF_WEEK:
            /* Mm.n.d - nth "dth day" of month m.  */

            /* Use Zeller's Congruence to get day-of-week of first day of
               month.
            */
            m1 = ( rulep->mon + 9 ) % 12 + 1;
            yy0 = ( rulep->mon <= 2 ) ? ( year - 1 ) : year;
            yy1 = yy0 / 100;
            yy2 = yy0 % 100;
            dow = ( ( 26 * m1 - 2 ) / 10 + 1 + yy2 + yy2 / 4 + yy1 / 4 - 2 * yy1 ) % 7;

            if ( dow < 0 )
            {
                dow += DAYSPERWEEK;
            }

            /* "dow" is the day-of-week of the first day of the month. Get
               the day-of-month (zero-origin) of the first "dow" day of the
               month.
            */
            d = rulep->day - dow;

            if ( d < 0 )
            {
                d += DAYSPERWEEK;
            }

            for ( i = 1; i < rulep->week; ++i )
            {
                if ( d + DAYSPERWEEK >= mon_lengths[ leapyear ][ rulep->mon - 1 ] )
                {
                    break;
                }

                d += DAYSPERWEEK;
            }

            /* "d" is the day-of-month (zero-origin) of the day we want. */
            value = d * SECSPERDAY;

            for ( i = 0; i < rulep->mon - 1; ++i )
            {
                value += mon_lengths[ leapyear ][ i ] * SECSPERDAY;
            }

            break;
    }

    /* "value" is the year-relative time of 00:00:00 UT on the day in
       question. To get the year-relative time of the specified local
       time on that day, add the transition time and the current offset
       from UT.
    */
    return value + rulep->time + offset;
}